

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

uint __thiscall
llvm::SourceMgr::AddIncludeFile
          (SourceMgr *this,string *Filename,SMLoc IncludeLoc,string *IncludedFile)

{
  bool bVar1;
  size_type sVar2;
  reference __lhs;
  reference ptVar3;
  byte local_111;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_100;
  undefined4 local_f4;
  Twine local_f0;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> local_d8;
  StringRef local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint local_70;
  uint local_6c;
  uint e;
  uint i;
  undefined1 local_50 [8];
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  NewBufOrErr;
  string *IncludedFile_local;
  string *Filename_local;
  SourceMgr *this_local;
  SMLoc IncludeLoc_local;
  
  NewBufOrErr._16_8_ = IncludedFile;
  std::__cxx11::string::operator=((string *)IncludedFile,(string *)Filename);
  Twine::Twine((Twine *)&e,(string *)NewBufOrErr._16_8_);
  MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)local_50,(Twine *)&e,-1,true,false);
  local_6c = 0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->IncludeDirectories);
  local_70 = (uint)sVar2;
  while( true ) {
    local_111 = 0;
    if (local_6c != local_70) {
      bVar1 = ErrorOr::operator_cast_to_bool((ErrorOr *)local_50);
      local_111 = bVar1 ^ 0xff;
    }
    if ((local_111 & 1) == 0) break;
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->IncludeDirectories,(ulong)local_6c);
    local_c0 = sys::path::get_separator(native);
    std::operator+(&local_b0,__lhs,local_c0.Data);
    std::operator+(&local_90,&local_b0,Filename);
    std::__cxx11::string::operator=((string *)NewBufOrErr._16_8_,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    Twine::Twine(&local_f0,(string *)NewBufOrErr._16_8_);
    MemoryBuffer::getFile(&local_d8,&local_f0,-1,true,false);
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    operator=((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
               *)local_50,&local_d8);
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    ~ErrorOr(&local_d8);
    local_6c = local_6c + 1;
  }
  bVar1 = ErrorOr::operator_cast_to_bool((ErrorOr *)local_50);
  if (bVar1) {
    ptVar3 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::operator*((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                          *)local_50);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::unique_ptr
              (&local_100,ptVar3);
    IncludeLoc_local.Ptr._4_4_ = AddNewSourceBuffer(this,&local_100,IncludeLoc);
    std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
              (&local_100);
  }
  else {
    IncludeLoc_local.Ptr._4_4_ = 0;
  }
  local_f4 = 1;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::~ErrorOr
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)local_50);
  return IncludeLoc_local.Ptr._4_4_;
}

Assistant:

unsigned SourceMgr::AddIncludeFile(const std::string &Filename,
                                   SMLoc IncludeLoc,
                                   std::string &IncludedFile) {
  IncludedFile = Filename;
  ErrorOr<std::unique_ptr<MemoryBuffer>> NewBufOrErr =
    MemoryBuffer::getFile(IncludedFile);

  // If the file didn't exist directly, see if it's in an include path.
  for (unsigned i = 0, e = IncludeDirectories.size(); i != e && !NewBufOrErr;
       ++i) {
    IncludedFile =
        IncludeDirectories[i] + sys::path::get_separator().data() + Filename;
    NewBufOrErr = MemoryBuffer::getFile(IncludedFile);
  }

  if (!NewBufOrErr)
    return 0;

  return AddNewSourceBuffer(std::move(*NewBufOrErr), IncludeLoc);
}